

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O0

string * __thiscall
absl::flags_internal::Unparse_abi_cxx11_
          (string *__return_storage_ptr__,flags_internal *this,unsigned_short v)

{
  undefined2 extraout_DX;
  undefined6 extraout_var;
  AlphaNum local_48;
  ushort local_12;
  string *psStack_10;
  unsigned_short v_local;
  
  local_12 = (ushort)this;
  psStack_10 = __return_storage_ptr__;
  AlphaNum::AlphaNum(&local_48,(uint)local_12);
  StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_48,
                    (AlphaNum *)CONCAT62(extraout_var,extraout_DX));
  return __return_storage_ptr__;
}

Assistant:

std::string Unparse(unsigned short v) { return absl::StrCat(v); }